

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_lmb.cpp
# Opt level: O3

size_t LMBCSConversionWorker
                 (UConverterDataLMBCS *extraInfo,ulmbcs_byte_t group,ulmbcs_byte_t *pStartLMBCS,
                 UChar *pUniChar,ulmbcs_byte_t *lastConverterIndex,UBool *groups_tried)

{
  int32_t iVar1;
  undefined8 in_RAX;
  ulmbcs_byte_t *puVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  uint32_t value;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  uVar3 = CONCAT71(in_register_00000031,group) & 0xffffffff;
  iVar1 = ucnv_MBCSFromUChar32_63
                    (extraInfo->OptGrpConverter[uVar3],(uint)pUniChar & 0xffff,&local_34,'\0');
  if (iVar1 < 1) {
    groups_tried[uVar3] = '\x01';
  }
  else {
    *lastConverterIndex = group;
    puVar2 = pStartLMBCS;
    if ((group != '\0') && (extraInfo->OptGroup != group)) {
      *pStartLMBCS = group;
      if (group < 0x10 || iVar1 != 1) {
        puVar2 = pStartLMBCS + 1;
      }
      else {
        puVar2 = pStartLMBCS + 2;
        pStartLMBCS[1] = group;
      }
    }
    if ((iVar1 != 1) || ((0xe0 << ((char)iVar1 * '\b' - 8U & 0x1f) & local_34) != 0)) {
      switch(iVar1) {
      case 4:
        *puVar2 = (ulmbcs_byte_t)(local_34 >> 0x18);
        puVar2 = puVar2 + 1;
      case 3:
        *puVar2 = (ulmbcs_byte_t)(local_34 >> 0x10);
        puVar2 = puVar2 + 1;
      case 2:
        *puVar2 = (ulmbcs_byte_t)(local_34 >> 8);
        puVar2 = puVar2 + 1;
      case 1:
        *puVar2 = (ulmbcs_byte_t)local_34;
        puVar2 = puVar2 + 1;
      default:
        return (long)puVar2 - (long)pStartLMBCS;
      }
    }
  }
  return 0;
}

Assistant:

static size_t
LMBCSConversionWorker (
   UConverterDataLMBCS * extraInfo,    /* subconverters, opt & locale groups */
   ulmbcs_byte_t group,                /* The group to try */
   ulmbcs_byte_t  * pStartLMBCS,              /* where to put the results */
   UChar * pUniChar,                   /* The input unicode character */
   ulmbcs_byte_t * lastConverterIndex, /* output: track last successful group used */
   UBool * groups_tried                /* output: track any unsuccessful groups */
)   
{
   ulmbcs_byte_t  * pLMBCS = pStartLMBCS;
   UConverterSharedData * xcnv = extraInfo->OptGrpConverter[group];

   int bytesConverted;
   uint32_t value;
   ulmbcs_byte_t firstByte;

   U_ASSERT(xcnv);
   U_ASSERT(group<ULMBCS_GRP_UNICODE);

   bytesConverted = ucnv_MBCSFromUChar32(xcnv, *pUniChar, &value, FALSE);

   /* get the first result byte */
   if(bytesConverted > 0) {
      firstByte = (ulmbcs_byte_t)(value >> ((bytesConverted - 1) * 8));
   } else {
      /* most common failure mode is an unassigned character */
      groups_tried[group] = TRUE;
      return 0;
   }

   *lastConverterIndex = group;

   /* All initial byte values in lower ascii range should have been caught by now,
      except with the exception group.
    */
   U_ASSERT((firstByte <= ULMBCS_C0END) || (firstByte >= ULMBCS_C1START) || (group == ULMBCS_GRP_EXCEPT));
   
   /* use converted data: first write 0, 1 or two group bytes */
   if (group != ULMBCS_GRP_EXCEPT && extraInfo->OptGroup != group)
   {
      *pLMBCS++ = group;
      if (bytesConverted == 1 && group >= ULMBCS_DOUBLEOPTGROUP_START)
      {
         *pLMBCS++ = group;
      }
   }

  /* don't emit control chars */
   if ( bytesConverted == 1 && firstByte < 0x20 )
      return 0;


   /* then move over the converted data */
   switch(bytesConverted)
   {
   case 4:
      *pLMBCS++ = (ulmbcs_byte_t)(value >> 24);
      U_FALLTHROUGH;
   case 3:
      *pLMBCS++ = (ulmbcs_byte_t)(value >> 16);
      U_FALLTHROUGH;
   case 2:
      *pLMBCS++ = (ulmbcs_byte_t)(value >> 8);
      U_FALLTHROUGH;
   case 1:
      *pLMBCS++ = (ulmbcs_byte_t)value;
      U_FALLTHROUGH;
   default:
      /* will never occur */
      break;
   }

   return (pLMBCS - pStartLMBCS);
}